

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::Minefield_Response_NACK_PDU
          (Minefield_Response_NACK_PDU *this,EntityIdentifier *MinefieldID,
          EntityIdentifier *RequestingSimulationID,KUINT8 ReqID)

{
  KUINT8 ReqID_local;
  EntityIdentifier *RequestingSimulationID_local;
  EntityIdentifier *MinefieldID_local;
  Minefield_Response_NACK_PDU *this_local;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Response_NACK_PDU_003300f8;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReqID,RequestingSimulationID);
  this->m_ui8ReqID = ReqID;
  this->m_ui8NumMisPdus = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_vSeqNums);
  DATA_TYPE::EntityIdentifier::operator=(&(this->super_Minefield_Header).m_MinefieldID,MinefieldID);
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '(';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x1a;
  return;
}

Assistant:

Minefield_Response_NACK_PDU::Minefield_Response_NACK_PDU( const EntityIdentifier & MinefieldID, const EntityIdentifier & RequestingSimulationID,
        KUINT8 ReqID ) :
    m_ReqID( RequestingSimulationID ),
    m_ui8ReqID( ReqID ),
    m_ui8NumMisPdus( 0 )
{
    m_MinefieldID = MinefieldID;
    m_ui8PDUType = MinefieldResponseNAK_PDU_Type;
    m_ui16PDULength = MINEFIELD_RESPONSE_NACK_SIZE;
}